

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O0

bool __thiscall ezexample::ensure_ns_exists(ezexample *this,char c)

{
  char in_SIL;
  v_array<unsigned_char> *in_RDI;
  uchar *in_stack_ffffffffffffffd8;
  bool local_1;
  
  if (((in_RDI->_begin[0x3b0] & 1) == 0) || ((in_RDI->_begin[(long)(int)in_SIL + 0x3b1] & 1) == 0))
  {
    if ((*(byte *)((long)&in_RDI[2].end_array + (long)(int)in_SIL + 5) & 1) == 0) {
      v_array<unsigned_char>::push_back(in_RDI,in_stack_ffffffffffffffd8);
      *(undefined1 *)((long)&in_RDI[2].end_array + (long)(int)in_SIL + 5) = 1;
      local_1 = false;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ensure_ns_exists(char c)  // returns TRUE iff we should ignore it :)
  {
    if (vw_ref->ignore_some && vw_ref->ignore[(int)c])
      return true;
    if (ns_exists[(int)c])
      return false;
    ec->indices.push_back((size_t)c);
    ns_exists[(int)c] = true;
    return false;
  }